

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O0

void __thiscall
QStyleOptionToolButton::QStyleOptionToolButton
          (QStyleOptionToolButton *this,QStyleOptionToolButton *other)

{
  QStyleOptionToolButton *in_RSI;
  QStyleOptionToolButton *in_RDI;
  
  QStyleOptionComplex::QStyleOptionComplex
            (&in_RSI->super_QStyleOptionComplex,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  QFlags<QStyleOptionToolButton::ToolButtonFeature>::QFlags
            ((QFlags<QStyleOptionToolButton::ToolButtonFeature> *)0x3eeb97);
  QIcon::QIcon(&in_RDI->icon);
  QSize::QSize((QSize *)in_RSI);
  QString::QString((QString *)0x3eebbe);
  QPoint::QPoint((QPoint *)in_RSI);
  QFont::QFont(&in_RDI->font);
  operator=(in_RSI,in_RDI);
  return;
}

Assistant:

QStyleOptionToolButton(const QStyleOptionToolButton &other) : QStyleOptionComplex(Version, Type) { *this = other; }